

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O1

int loader_impl_handle_initialize
              (plugin_manager manager,plugin p,loader_impl impl,char *name,void **handle_ptr)

{
  bool bVar1;
  int iVar2;
  loader_impl_interface iface;
  size_t sVar3;
  set_value pvVar4;
  undefined8 *puVar5;
  size_t sVar6;
  loader_handle_impl handle_impl;
  loader_path path;
  loader_handle_impl local_1040;
  char local_1038 [4104];
  
  if (impl == (loader_impl)0x0) {
    return 1;
  }
  iface = (loader_impl_interface)plugin_iface(p);
  if (iface == (loader_impl_interface)0x0) {
    bVar1 = true;
    goto LAB_00124032;
  }
  iVar2 = loader_impl_initialize(manager,p,impl);
  p = (plugin)0x1;
  if (iVar2 == 0) {
    sVar3 = loader_impl_handle_name(manager,name,local_1038);
    if (1 < sVar3) {
      pvVar4 = set_get(impl->handle_impl_path_map,local_1038);
      if (pvVar4 != (set_value)0x0) {
        bVar1 = false;
        log_write_impl_va("metacall",0x502,"loader_impl_handle_initialize",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                          ,LOG_LEVEL_ERROR,
                          "Initialize handle failed, handle with name %s already loaded",local_1038)
        ;
        goto LAB_00124032;
      }
    }
    sVar3 = vector_size(impl->handle_impl_init_order);
    vector_push_back_empty(impl->handle_impl_init_order);
    p = (plugin)0x0;
    local_1040 = loader_impl_load_handle(impl,iface,(loader_handle)0x0,local_1038,0x1000);
    bVar1 = true;
    if (local_1040 == (loader_handle_impl)0x0) goto LAB_00124032;
    local_1040->populated = 1;
    iVar2 = set_insert(impl->handle_impl_path_map,local_1040->path,local_1040);
    if (iVar2 == 0) {
      iVar2 = loader_impl_handle_register(manager,impl,local_1038,local_1040,handle_ptr);
      if (iVar2 == 0) {
        vector_set(impl->handle_impl_init_order,sVar3,&local_1040);
        goto LAB_0012402a;
      }
      set_remove(impl->handle_impl_path_map,local_1040->path);
    }
    while( true ) {
      sVar3 = sVar3 + 1;
      sVar6 = vector_size(impl->handle_impl_init_order);
      if (sVar6 <= sVar3) break;
      puVar5 = (undefined8 *)vector_at(impl->handle_impl_init_order,sVar3);
      loader_impl_destroy_handle((loader_handle_impl)*puVar5);
    }
    vector_pop_back(impl->handle_impl_init_order);
    log_write_impl_va("metacall",0x52a,"loader_impl_handle_initialize",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                      ,LOG_LEVEL_ERROR,"Error when loading handle: %s",local_1038);
    loader_impl_destroy_handle(local_1040);
  }
  else {
LAB_0012402a:
    bVar1 = false;
  }
LAB_00124032:
  if (bVar1) {
    return 1;
  }
  return (int)p;
}

Assistant:

int loader_impl_handle_initialize(plugin_manager manager, plugin p, loader_impl impl, const loader_path name, void **handle_ptr)
{
	if (impl != NULL)
	{
		loader_impl_interface iface = loader_iface(p);

		if (iface != NULL)
		{
			loader_path path;
			size_t init_order;

			if (loader_impl_initialize(manager, p, impl) != 0)
			{
				return 1;
			}

			if (loader_impl_handle_name(manager, name, path) > 1 && loader_impl_get_handle(impl, path) != NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Initialize handle failed, handle with name %s already loaded", path);

				return 1;
			}

			init_order = vector_size(impl->handle_impl_init_order);

			vector_push_back_empty(impl->handle_impl_init_order);

			loader_handle_impl handle_impl = loader_impl_load_handle(impl, iface, NULL, path, LOADER_PATH_SIZE);

			if (handle_impl != NULL)
			{
				handle_impl->populated = 1;

				if (set_insert(impl->handle_impl_path_map, handle_impl->path, handle_impl) == 0)
				{
					if (loader_impl_handle_register(manager, impl, path, handle_impl, handle_ptr) == 0)
					{
						vector_set_var(impl->handle_impl_init_order, init_order, handle_impl);

						return 0;
					}

					set_remove(impl->handle_impl_path_map, handle_impl->path);
				}

				{
					size_t iterator;

					for (iterator = init_order + 1; iterator < vector_size(impl->handle_impl_init_order); ++iterator)
					{
						loader_handle_impl iterator_handle_impl = vector_at_type(impl->handle_impl_init_order, iterator, loader_handle_impl);

						loader_impl_destroy_handle(iterator_handle_impl);
					}

					vector_pop_back(impl->handle_impl_init_order);
				}

				log_write("metacall", LOG_LEVEL_ERROR, "Error when loading handle: %s", path);

				loader_impl_destroy_handle(handle_impl);
			}
		}
	}

	return 1;
}